

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v6::internal::write_exponent<char,char*>(int exp,char *it)

{
  long lVar1;
  undefined1 *in_RSI;
  int in_EDI;
  char *d;
  char *top;
  int in_stack_ffffffffffffffdc;
  char *in_stack_ffffffffffffffe0;
  undefined1 *local_10;
  int local_4;
  
  if ((-10000 < in_EDI) && (in_EDI < 10000)) {
    if (in_EDI < 0) {
      *in_RSI = 0x2d;
      local_4 = -in_EDI;
    }
    else {
      *in_RSI = 0x2b;
      local_4 = in_EDI;
    }
    local_10 = in_RSI + 1;
    if (99 < local_4) {
      lVar1 = (long)(local_4 / 100 << 1);
      if (999 < local_4) {
        *local_10 = basic_data<void>::digits[lVar1];
        local_10 = in_RSI + 2;
      }
      *local_10 = basic_data<void>::digits[lVar1 + 1];
      local_4 = local_4 % 100;
      local_10 = local_10 + 1;
    }
    *local_10 = basic_data<void>::digits[local_4 << 1];
    local_10[1] = basic_data<void>::digits[(long)(local_4 << 1) + 1];
    return local_10 + 2;
  }
  assert_fail(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,(char *)0x243c4c);
}

Assistant:

It write_exponent(int exp, It it) {
  FMT_ASSERT(-10000 < exp && exp < 10000, "exponent out of range");
  if (exp < 0) {
    *it++ = static_cast<Char>('-');
    exp = -exp;
  } else {
    *it++ = static_cast<Char>('+');
  }
  if (exp >= 100) {
    const char* top = data::digits + (exp / 100) * 2;
    if (exp >= 1000) *it++ = static_cast<Char>(top[0]);
    *it++ = static_cast<Char>(top[1]);
    exp %= 100;
  }
  const char* d = data::digits + exp * 2;
  *it++ = static_cast<Char>(d[0]);
  *it++ = static_cast<Char>(d[1]);
  return it;
}